

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O2

cJSON_bool cJSON_InsertItemInArray(cJSON *array,int which,cJSON *newitem)

{
  cJSON_bool cVar1;
  cJSON *pcVar2;
  
  if (which < 0) {
    cVar1 = 0;
  }
  else {
    pcVar2 = get_array_item(array,(ulong)(uint)which);
    if (pcVar2 == (cJSON *)0x0) {
      cVar1 = add_item_to_array(array,newitem);
      return cVar1;
    }
    newitem->next = pcVar2;
    newitem->prev = pcVar2->prev;
    pcVar2->prev = newitem;
    if (pcVar2 == array->child) {
      array->child = newitem;
    }
    else {
      newitem->prev->next = newitem;
    }
    cVar1 = 1;
  }
  return cVar1;
}

Assistant:

CJSON_PUBLIC(cJSON_bool) cJSON_InsertItemInArray(cJSON *array, int which, cJSON *newitem)
{
    cJSON *after_inserted = NULL;

    if (which < 0)
    {
        return false;
    }

    after_inserted = get_array_item(array, (size_t)which);
    if (after_inserted == NULL)
    {
        return add_item_to_array(array, newitem);
    }

    newitem->next = after_inserted;
    newitem->prev = after_inserted->prev;
    after_inserted->prev = newitem;
    if (after_inserted == array->child)
    {
        array->child = newitem;
    }
    else
    {
        newitem->prev->next = newitem;
    }
    return true;
}